

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-list.c
# Opt level: O3

void monster_list_free(monster_list_t *list)

{
  if (list != (monster_list_t *)0x0) {
    if (list->entries != (monster_list_entry_t *)0x0) {
      mem_free(list->entries);
      list->entries = (monster_list_entry_t *)0x0;
    }
    mem_free(list);
    return;
  }
  return;
}

Assistant:

void monster_list_free(monster_list_t *list)
{
	if (list == NULL)
		return;

	if (list->entries != NULL) {
		mem_free(list->entries);
		list->entries = NULL;
	}

	mem_free(list);
	list = NULL;
}